

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadMultiTransformNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 *puVar1;
  XML *this_00;
  undefined8 uVar2;
  _Alloc_hider __nptr;
  int iVar3;
  uint uVar4;
  int *piVar5;
  long lVar6;
  size_t sVar7;
  undefined8 extraout_RAX;
  MultiTransformNode *pMVar8;
  GroupNode *this_01;
  pointer pTVar9;
  runtime_error *this_02;
  long *plVar10;
  undefined8 uVar11;
  uint uVar12;
  size_t *psVar13;
  long *in_RDX;
  ulong uVar14;
  char *this_03;
  pointer pcVar15;
  string str_time_steps;
  undefined1 local_d0 [32];
  undefined1 local_b0 [40];
  XMLLoader *local_88;
  XMLLoader *local_80;
  size_t local_78;
  string local_70;
  string local_50;
  
  this_00 = (XML *)*in_RDX;
  local_b0._0_8_ = local_b0 + 0x10;
  local_88 = this;
  local_80 = (XMLLoader *)xml;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"time_steps","");
  XML::parm(&local_70,this_00,(string *)local_b0);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_70);
  __nptr._M_p = local_70._M_dataplus._M_p;
  if (iVar3 == 0) {
    uVar12 = 1;
LAB_0018b2f7:
    pcVar15 = (pointer)(ulong)uVar12;
    local_b0._8_8_ = (pointer)0x0;
    local_b0._16_8_ = 0;
    local_b0._24_8_ = 0;
    local_b0._24_8_ = alignedMalloc((long)pcVar15 << 5,8);
    sVar7 = 0;
    do {
      puVar1 = (undefined8 *)(local_b0._24_8_ + sVar7 + 8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(local_b0._24_8_ + sVar7 + 0x18) = 0;
      sVar7 = sVar7 + 0x20;
    } while ((long)pcVar15 << 5 != sVar7);
    lVar6 = 0;
    local_78 = 0;
    local_b0._8_8_ = pcVar15;
    local_b0._16_8_ = pcVar15;
    do {
      iVar3 = std::__cxx11::string::compare
                        ((char *)(*(long *)(*(long *)(*in_RDX + 0x80) + lVar6) + 0x30));
      if (iVar3 == 0) {
        loadAffineSpace3faArray
                  ((avector<AffineSpace3ff> *)local_d0,local_80,
                   (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar6));
        uVar2 = local_b0._24_8_;
        alignedFree(*(void **)(local_b0._24_8_ + 0x18 + lVar6 * 4));
        uVar11 = local_d0._8_8_;
        local_d0._8_8_ = 0;
        psVar13 = (size_t *)(uVar2 + 8 + lVar6 * 4);
        *psVar13 = uVar11;
        psVar13[1] = local_d0._16_8_;
        local_d0._16_8_ = 0;
        *(undefined8 *)(uVar2 + 0x18 + lVar6 * 4) = local_d0._24_8_;
        local_d0._24_8_ = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        alignedFree((void *)0x0);
      }
      else {
        this_03 = "QuaternionArray";
        iVar3 = std::__cxx11::string::compare
                          ((char *)(*(long *)(*(long *)(*in_RDX + 0x80) + lVar6) + 0x30));
        if (iVar3 != 0) {
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          ParseLocation::str_abi_cxx11_(&local_50,(ParseLocation *)(*in_RDX + 0x10));
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_d0._0_8_ = *plVar10;
          psVar13 = (size_t *)(plVar10 + 2);
          if ((size_t *)local_d0._0_8_ == psVar13) {
            local_d0._16_8_ = *psVar13;
            local_d0._24_8_ = plVar10[3];
            local_d0._0_8_ = local_d0 + 0x10;
          }
          else {
            local_d0._16_8_ = *psVar13;
          }
          local_d0._8_8_ = plVar10[1];
          *plVar10 = (long)psVar13;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::runtime_error::runtime_error(this_02,(string *)local_d0);
          __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        loadQuaternionArray((avector<AffineSpace3ff> *)local_d0,(XMLLoader *)this_03,
                            (Ref<embree::XML> *)(*(long *)(*in_RDX + 0x80) + lVar6));
        uVar2 = local_b0._24_8_;
        alignedFree(*(void **)(local_b0._24_8_ + 0x18 + lVar6 * 4));
        uVar11 = local_d0._8_8_;
        local_d0._8_8_ = 0;
        psVar13 = (size_t *)(uVar2 + 8 + lVar6 * 4);
        *psVar13 = uVar11;
        psVar13[1] = local_d0._16_8_;
        local_d0._16_8_ = 0;
        *(undefined8 *)(uVar2 + 0x18 + lVar6 * 4) = local_d0._24_8_;
        local_d0._24_8_ = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
        alignedFree((void *)0x0);
        local_78 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      lVar6 = lVar6 + 8;
    } while ((long)pcVar15 * 8 - lVar6 != 0);
    if (*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3 == (ulong)(uVar12 + 1)) {
      pMVar8 = (MultiTransformNode *)alignedMalloc(0x88,0x10);
      loadNode((XMLLoader *)local_d0,(Ref<embree::XML> *)local_80);
      SceneGraph::MultiTransformNode::MultiTransformNode
                (pMVar8,(avector<avector<AffineSpace3ff>_> *)local_b0,
                 (Ref<embree::SceneGraph::Node> *)local_d0);
      sVar7 = local_78;
      if ((GroupNode *)local_d0._0_8_ != (GroupNode *)0x0) {
        (**(code **)(*(long *)local_d0._0_8_ + 0x18))();
      }
      pTVar9 = (pMVar8->spaces).
               super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pMVar8->spaces).
          super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar9) {
        lVar6 = 0x28;
        uVar14 = 0;
        do {
          *(byte *)((long)&(pTVar9->time_range).lower + lVar6) = (byte)sVar7 & 1;
          uVar14 = uVar14 + 1;
          pTVar9 = (pMVar8->spaces).
                   super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 0x30;
        } while (uVar14 < (ulong)(((long)(pMVar8->spaces).
                                         super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9
                                  >> 4) * -0x5555555555555555));
      }
      (local_88->path).filename._M_dataplus._M_p = (pointer)pMVar8;
      (**(code **)((long)(pMVar8->super_Node).super_RefCount._vptr_RefCount + 0x10))(pMVar8);
    }
    else {
      this_01 = (GroupNode *)operator_new(0x80);
      SceneGraph::GroupNode::GroupNode(this_01,0);
      (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
      local_b0._32_8_ = this_01;
      if (pcVar15 < (pointer)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3)) {
        do {
          loadNode((XMLLoader *)local_d0,(Ref<embree::XML> *)local_80);
          if (((GroupNode *)local_d0._0_8_ != (GroupNode *)0x0) &&
             (std::
              vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
              ::push_back(&this_01->children,(value_type *)local_d0),
             (GroupNode *)local_d0._0_8_ != (GroupNode *)0x0)) {
            (**(code **)(*(long *)local_d0._0_8_ + 0x18))();
          }
          pcVar15 = pcVar15 + 1;
        } while (pcVar15 < (pointer)(*(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80) >> 3));
      }
      uVar11 = local_b0._32_8_;
      pMVar8 = (MultiTransformNode *)alignedMalloc(0x88,0x10);
      local_d0._0_8_ = uVar11;
      (**(code **)(*(long *)uVar11 + 0x10))(uVar11);
      sVar7 = local_78;
      SceneGraph::MultiTransformNode::MultiTransformNode
                (pMVar8,(avector<avector<AffineSpace3ff>_> *)local_b0,
                 (Ref<embree::SceneGraph::Node> *)local_d0);
      if ((GroupNode *)local_d0._0_8_ != (GroupNode *)0x0) {
        (**(code **)(*(long *)local_d0._0_8_ + 0x18))();
      }
      pTVar9 = (pMVar8->spaces).
               super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pMVar8->spaces).
          super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar9) {
        lVar6 = 0x28;
        uVar14 = 0;
        do {
          *(byte *)((long)&(pTVar9->time_range).lower + lVar6) = (byte)sVar7 & 1;
          uVar14 = uVar14 + 1;
          pTVar9 = (pMVar8->spaces).
                   super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 0x30;
        } while (uVar14 < (ulong)(((long)(pMVar8->spaces).
                                         super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9
                                  >> 4) * -0x5555555555555555));
      }
      (local_88->path).filename._M_dataplus._M_p = (pointer)pMVar8;
      (**(code **)((long)(pMVar8->super_Node).super_RefCount._vptr_RefCount + 0x10))(pMVar8);
      (**(code **)(*(long *)uVar11 + 0x18))(uVar11);
    }
    if ((pointer)local_b0._8_8_ != (pointer)0x0) {
      lVar6 = 0x18;
      pcVar15 = (pointer)0x0;
      do {
        uVar11 = local_b0._24_8_;
        alignedFree(*(void **)(local_b0._24_8_ + lVar6));
        pcVar15 = pcVar15 + 1;
        puVar1 = (undefined8 *)(uVar11 + -0x10 + lVar6);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)(uVar11 + lVar6) = 0;
        lVar6 = lVar6 + 0x20;
      } while (pcVar15 < (ulong)local_b0._8_8_);
    }
    alignedFree((void *)local_b0._24_8_);
    alignedFree((void *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    return (Ref<embree::SceneGraph::Node>)(Node *)local_88;
  }
  piVar5 = __errno_location();
  iVar3 = *piVar5;
  *piVar5 = 0;
  lVar6 = strtol(__nptr._M_p,(char **)local_b0,10);
  if ((pointer)local_b0._0_8_ == __nptr._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    uVar4 = (uint)lVar6;
    if (((int)uVar4 == lVar6) && (*piVar5 != 0x22)) {
      if (*piVar5 == 0) {
        *piVar5 = iVar3;
      }
      uVar12 = 1;
      if (1 < (int)uVar4) {
        uVar12 = uVar4;
      }
      goto LAB_0018b2f7;
    }
  }
  uVar11 = std::__throw_out_of_range("stoi");
  __clang_call_terminate(uVar11);
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadMultiTransformNode(const Ref<XML>& xml) 
  {
    /* parse number of time steps to use for instanced geometry */
    int time_steps = 1;
    std::string str_time_steps = xml->parm("time_steps");
    if (str_time_steps != "") time_steps = max(1,std::stoi(str_time_steps));

    bool quaternion = false;
    avector<AffineSpace3ff> space;
    avector<avector<AffineSpace3ff>> spaces(time_steps);
    size_t j = 0;
    for (size_t i=0; i<time_steps; i++) {
      if (xml->children[i]->name == "AffineSpaceArray") {
        spaces[j++] = loadAffineSpace3faArray(xml->children[i]);
      }
      else if (xml->children[i]->name == "QuaternionArray") {
        spaces[j++] = loadQuaternionArray(xml->children[i]);
        quaternion = true;
      }
      else {
        THROW_RUNTIME_ERROR(xml->loc.str()+": unknown transformation representation");
      }
    }
    assert(j == time_steps);

    if (xml->size() == time_steps+1) {
      auto node = new SceneGraph::MultiTransformNode(spaces,loadNode(xml->children[time_steps]));
      for (size_t i = 0; i < node->spaces.size(); ++i) {
        node->spaces[i].quaternion = quaternion;
      }
      return node;
    }

    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
    for (size_t i=time_steps; i<xml->size(); i++)
      group->add(loadNode(xml->children[i]));

    auto node = new  SceneGraph::MultiTransformNode(spaces,group.dynamicCast<SceneGraph::Node>());
    for (size_t i = 0; i < node->spaces.size(); ++i) {
      node->spaces[i].quaternion = quaternion;
    }
    return node;
  }